

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O0

void __thiscall phyr::FPError::FPError(FPError *this,double _v,double _error)

{
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar1;
  double dVar2;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int delta;
  
  dVar2 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  *in_RDI = in_XMM0_Qa;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    delta = (int)((ulong)in_RDI >> 0x20);
    dVar1 = nextFloatDown(dVar2,delta);
    in_RDI[1] = dVar1;
    dVar2 = nextFloatUp(dVar2,delta);
    in_RDI[2] = dVar2;
  }
  else {
    in_RDI[2] = *in_RDI;
    in_RDI[1] = *in_RDI;
  }
  return;
}

Assistant:

FPError(Real _v, Real _error = 0) {
        v = _v;
        if (_error == 0)
            lBound = uBound = v;
        else {
            lBound = nextFloatDown(v - _error);
            uBound = nextFloatUp(v + _error);
        }
    }